

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong *puVar1;
  long lVar2;
  ctrl_t *pcVar3;
  bool bVar4;
  uintptr_t v;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  ctrl_t cVar9;
  ulong uVar10;
  ulong uVar11;
  FindInfo FVar12;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58.heap.control = (common->heap_or_soo_).heap.control;
    local_58.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,8,0x20);
    if (local_48 != 0) {
      if (bVar4) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,void>,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                  ((HashSetResizeHelper *)&local_58.heap,common,
                   (allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>
                    *)common);
      }
      else {
        if ((char)local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
        sVar7 = 0;
        sVar6 = local_48;
        uVar8 = local_58.heap.slot_array;
        do {
          if ((char)local_3f == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_58.heap.control[sVar7]) {
            uVar10 = (*(ulong *)uVar8 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                     -0x234dd359734ecb13;
            uVar11 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                       (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                       (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                       (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ *(ulong *)uVar8) *
                     -0x234dd359734ecb13;
            FVar12 = find_first_non_full<void>
                               (common,uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                       (uVar11 & 0xff0000000000) >> 0x18 |
                                       (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                                       (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
                                       uVar11 << 0x38);
            uVar5 = FVar12.offset;
            uVar10 = common->capacity_;
            if (uVar10 <= uVar5) {
              __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x744,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar9 = (ctrl_t)(uVar11 >> 0x38) & ~kEmpty;
            pcVar3 = (common->heap_or_soo_).heap.control;
            pcVar3[uVar5] = cVar9;
            pcVar3[(ulong)((uint)uVar10 & 0xf) + (uVar5 - 0xf & uVar10)] = cVar9;
            common->capacity_ = 0xffffffffffffff9c;
            uVar11 = *(ulong *)(uVar8 + 8);
            puVar1 = (ulong *)(lVar2 + uVar5 * 0x20);
            *puVar1 = *(ulong *)uVar8;
            puVar1[1] = uVar11;
            uVar11 = *(ulong *)(uVar8 + 0x18);
            puVar1 = (ulong *)(lVar2 + 0x10 + uVar5 * 0x20);
            *puVar1 = *(ulong *)(uVar8 + 0x10);
            puVar1[1] = uVar11;
            *(ulong *)(uVar8 + 8) = 0;
            *(ulong *)(uVar8 + 0x10) = 0;
            *(ulong *)(uVar8 + 0x18) = 0;
            CommonFields::set_capacity(common,uVar10);
            sVar6 = local_48;
          }
          sVar7 = sVar7 + 1;
          uVar8 = uVar8 + 0x20;
        } while (sVar7 != sVar6);
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }